

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncFrac(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
           vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  double dVar2;
  double intPart;
  double local_10;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar1->type == Float) {
    dVar2 = modf((pEVar1->field_1).floatValue,&local_10);
    (__return_storage_ptr__->field_1).floatValue = dVar2;
    __return_storage_ptr__->type = Float;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFrac(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double intPart;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Float:
		result.floatValue = modf(parameters[0].floatValue,&intPart);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::Float;
	return result;
}